

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# draco_encoder.cc
# Opt level: O0

void anon_unknown.dwarf_8bad::PrintOptions(PointCloud *pc,Options *options)

{
  int32_t iVar1;
  PointCloud *in_RSI;
  Type in_stack_ffffffffffffffec;
  
  printf("Encoder options:\n");
  printf("  Compression level = %d\n",
         (ulong)*(uint *)&(in_RSI->attributes_).
                          super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (*(int *)((long)&in_RSI->_vptr_PointCloud + 4) == 0) {
    printf("  Positions: No quantization\n");
  }
  else {
    printf("  Positions: Quantization = %d bits\n",
           (ulong)*(uint *)((long)&in_RSI->_vptr_PointCloud + 4));
  }
  iVar1 = draco::PointCloud::GetNamedAttributeId(in_RSI,in_stack_ffffffffffffffec);
  if (iVar1 < 0) {
    if ((*(byte *)((long)&(in_RSI->metadata_)._M_t.
                          super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
                          .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl + 4)
        & 1) != 0) {
      printf("  Texture coordinates: Skipped\n");
    }
  }
  else if (*(int *)&(in_RSI->metadata_)._M_t.
                    super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
                    .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl == 0) {
    printf("  Texture coordinates: No quantization\n");
  }
  else {
    printf("  Texture coordinates: Quantization = %d bits\n",
           (ulong)*(uint *)&(in_RSI->metadata_)._M_t.
                            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
                            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl);
  }
  iVar1 = draco::PointCloud::GetNamedAttributeId(in_RSI,in_stack_ffffffffffffffec);
  if (iVar1 < 0) {
    if (((ulong)(in_RSI->attributes_).
                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start & 0x100000000) != 0) {
      printf("  Normals: Skipped\n");
    }
  }
  else if (*(int *)&(in_RSI->attributes_).
                    super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == 0) {
    printf("  Normals: No quantization\n");
  }
  else {
    printf("  Normals: Quantization = %d bits\n",
           (ulong)*(uint *)&(in_RSI->attributes_).
                            super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  }
  iVar1 = draco::PointCloud::GetNamedAttributeId(in_RSI,in_stack_ffffffffffffffec);
  if (iVar1 < 0) {
    if (((ulong)(in_RSI->attributes_).
                super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish & 0x100000000) != 0) {
      printf("  Generic: Skipped\n");
    }
  }
  else if (*(int *)&(in_RSI->attributes_).
                    super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish == 0) {
    printf("  Generic: No quantization\n");
  }
  else {
    printf("  Generic: Quantization = %d bits\n",
           (ulong)*(uint *)&(in_RSI->attributes_).
                            super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish);
  }
  printf("\n");
  return;
}

Assistant:

void PrintOptions(const draco::PointCloud &pc, const Options &options) {
  printf("Encoder options:\n");
  printf("  Compression level = %d\n", options.compression_level);
  if (options.pos_quantization_bits == 0) {
    printf("  Positions: No quantization\n");
  } else {
    printf("  Positions: Quantization = %d bits\n",
           options.pos_quantization_bits);
  }

  if (pc.GetNamedAttributeId(draco::GeometryAttribute::TEX_COORD) >= 0) {
    if (options.tex_coords_quantization_bits == 0) {
      printf("  Texture coordinates: No quantization\n");
    } else {
      printf("  Texture coordinates: Quantization = %d bits\n",
             options.tex_coords_quantization_bits);
    }
  } else if (options.tex_coords_deleted) {
    printf("  Texture coordinates: Skipped\n");
  }

  if (pc.GetNamedAttributeId(draco::GeometryAttribute::NORMAL) >= 0) {
    if (options.normals_quantization_bits == 0) {
      printf("  Normals: No quantization\n");
    } else {
      printf("  Normals: Quantization = %d bits\n",
             options.normals_quantization_bits);
    }
  } else if (options.normals_deleted) {
    printf("  Normals: Skipped\n");
  }

  if (pc.GetNamedAttributeId(draco::GeometryAttribute::GENERIC) >= 0) {
    if (options.generic_quantization_bits == 0) {
      printf("  Generic: No quantization\n");
    } else {
      printf("  Generic: Quantization = %d bits\n",
             options.generic_quantization_bits);
    }
  } else if (options.generic_deleted) {
    printf("  Generic: Skipped\n");
  }
  printf("\n");
}